

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void updateObjects(QList<const_QObject_*> *objects)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  QWidget *pQVar5;
  QObject **ppQVar6;
  QStyle *pQVar7;
  QList<const_QObject_*> *__range2;
  long lVar8;
  QWidget *this;
  long lVar9;
  QObject **ppQVar10;
  long in_FS_OFFSET;
  QObject *object;
  QArrayData *local_78;
  undefined8 uStack_70;
  qsizetype local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (styleSheetCaches->styleRulesCache).d;
  if (((((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) ||
       ((pDVar2 = (styleSheetCaches->hasStyleRuleCache).d, pDVar2 != (Data *)0x0 &&
        (pDVar2->size != 0)))) ||
      ((pDVar3 = (styleSheetCaches->renderRulesCache).d, pDVar3 != (Data *)0x0 &&
       (pDVar3->size != 0)))) && (lVar4 = (objects->d).size, lVar4 != 0)) {
    ppQVar10 = (objects->d).ptr;
    lVar9 = 0;
    do {
      local_78 = *(QArrayData **)((long)ppQVar10 + lVar9);
      QHash<QObject_const*,QList<QCss::StyleRule>>::removeImpl<QObject_const*>
                ((QHash<QObject_const*,QList<QCss::StyleRule>> *)&styleSheetCaches->styleRulesCache,
                 (QObject **)&local_78);
      QHash<QObject_const*,QHash<int,bool>>::removeImpl<QObject_const*>
                ((QHash<QObject_const*,QHash<int,bool>> *)&styleSheetCaches->hasStyleRuleCache,
                 (QObject **)&local_78);
      QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>>::
      removeImpl<QObject_const*>
                ((QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>> *)
                 &styleSheetCaches->renderRulesCache,(QObject **)&local_78);
      lVar9 = lVar9 + 8;
    } while (lVar4 << 3 != lVar9);
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_58,StyleChange);
  lVar4 = (objects->d).size;
  if (lVar4 != 0) {
    ppQVar10 = (objects->d).ptr;
    ppQVar6 = ppQVar10 + lVar4;
    do {
      pQVar5 = (QWidget *)*ppQVar10;
      if (pQVar5 == (QWidget *)0x0) {
        this = (QWidget *)0x0;
      }
      else {
        this = (QWidget *)0x0;
        if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
          this = pQVar5;
        }
      }
      if (this != (QWidget *)0x0) {
        pQVar7 = QWidget::style(this);
        (**(code **)(*(long *)pQVar7 + 0x60))(pQVar7,this);
        QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
        local_78 = (QArrayData *)0x0;
        uStack_70 = 0;
        local_68 = 0;
        QList<const_QObject_*>::reserve
                  ((QList<const_QObject_*> *)&local_78,
                   *(long *)(*(long *)&this->field_0x8 + 0x28) + 1);
        lVar4 = *(long *)(*(long *)&this->field_0x8 + 0x28);
        if (lVar4 != 0) {
          lVar9 = *(long *)(*(long *)&this->field_0x8 + 0x20);
          lVar8 = 0;
          do {
            local_40 = *(QObject **)(lVar9 + lVar8);
            QtPrivate::QPodArrayOps<QObject_const*>::emplace<QObject_const*&>
                      ((QPodArrayOps<QObject_const*> *)&local_78,local_68,&local_40);
            QList<const_QObject_*>::end((QList<const_QObject_*> *)&local_78);
            lVar8 = lVar8 + 8;
          } while (lVar4 << 3 != lVar8);
        }
        updateObjects((QList<const_QObject_*> *)&local_78);
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,8,0x10);
          }
        }
      }
      ppQVar10 = ppQVar10 + 1;
    } while (ppQVar10 != ppQVar6);
  }
  QEvent::~QEvent((QEvent *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void updateObjects(const QList<const QObject *>& objects)
{
    if (!styleSheetCaches->styleRulesCache.isEmpty() || !styleSheetCaches->hasStyleRuleCache.isEmpty() || !styleSheetCaches->renderRulesCache.isEmpty()) {
        for (const QObject *object : objects) {
            styleSheetCaches->styleRulesCache.remove(object);
            styleSheetCaches->hasStyleRuleCache.remove(object);
            styleSheetCaches->renderRulesCache.remove(object);
        }
    }

    QEvent event(QEvent::StyleChange);
    for (const QObject *object : objects) {
        if (auto widget = qobject_cast<QWidget*>(const_cast<QObject*>(object))) {
            widget->style()->polish(widget);
            QCoreApplication::sendEvent(widget, &event);
            QList<const QObject *> children;
            children.reserve(widget->children().size() + 1);
            for (auto child: std::as_const(widget->children()))
                children.append(child);
            updateObjects(children);
        }
    }
}